

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O3

bool __thiscall
ValueInfo::TryGetIntConstantValue(ValueInfo *this,int64 *intValueRef,bool isUnsigned)

{
  ValueStructureKind VVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (intValueRef == (int64 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.cpp"
                       ,0x29,"(intValueRef)","intValueRef");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  VVar1 = this->structureKind;
  if (VVar1 == Int64Constant) {
    AsInt64Constant(this);
    *intValueRef = (int64)this[1]._vptr_ValueInfo;
  }
  return VVar1 == Int64Constant;
}

Assistant:

bool ValueInfo::TryGetIntConstantValue(int64 *const intValueRef, const bool isUnsigned) const
{
    Assert(intValueRef);
    if (structureKind == ValueStructureKind::Int64Constant)
    {
        *intValueRef = AsInt64Constant()->IntValue();
        return true;
    }
    return false;
}